

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O0

index_type *
booster::locale::boundary::details::
mapping_traits<std::_List_iterator<char>,_std::bidirectional_iterator_tag>::map
          (boundary_type t,_List_iterator<char> b,_List_iterator<char> e,locale *l)

{
  boundary_indexing<char> *pbVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  undefined4 in_ESI;
  _List_iterator<char> in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  allocator<char> *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  _List_iterator<char> __beg;
  allocator<char> local_59 [17];
  string local_48 [44];
  undefined4 local_1c;
  
  __beg._M_node = in_RDI._M_node;
  local_1c = in_ESI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::_List_iterator<char>,void>
            (in_stack_ffffffffffffff70,__beg,in_RDI,in_stack_ffffffffffffff68);
  std::allocator<char>::~allocator(local_59);
  pbVar1 = std::use_facet<booster::locale::boundary::boundary_indexing<char>>
                     ((locale *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  uVar2 = std::__cxx11::string::c_str();
  lVar3 = std::__cxx11::string::c_str();
  lVar4 = std::__cxx11::string::size();
  (**(code **)(*(long *)pbVar1 + 0x10))(in_RDI._M_node,pbVar1,local_1c,uVar2,lVar3 + lVar4);
  std::__cxx11::string::~string(local_48);
  return (index_type *)__beg._M_node;
}

Assistant:

static index_type map(boundary_type t,IteratorType b,IteratorType e,std::locale const &l)
                    {
                        std::basic_string<char_type> str(b,e);
                        return std::use_facet<boundary_indexing<char_type> >(l).map(t,str.c_str(),str.c_str()+str.size());
                    }